

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_ntop.c
# Opt level: O2

int sock_pton_with_prefix(char *cp,sockaddr *sa,int *int_prefix)

{
  addrinfo *paVar1;
  FILE *__stream;
  int iVar2;
  ushort **ppuVar3;
  char *pcVar4;
  char *pcVar5;
  char cVar6;
  long lVar7;
  size_t __n;
  char *pcVar8;
  char *pcVar9;
  addrinfo **__pai;
  char *pcVar10;
  size_t size;
  char *s;
  ulong uVar11;
  ulong uVar12;
  addrinfo *servinfo;
  addrinfo local_68;
  
  if (int_prefix == (int *)0x0 || (sa == (sockaddr *)0x0 || cp == (char *)0x0)) {
    return -1;
  }
  ppuVar3 = __ctype_b_loc();
  lVar7 = -(long)cp;
  uVar12 = 0;
  do {
    uVar11 = uVar12;
    uVar12 = uVar11 + 1;
  } while ((*(byte *)((long)*ppuVar3 + (long)cp[uVar11] * 2 + 1) & 0x20) != 0);
  if (cp[uVar11] != '[') {
    return -2;
  }
  pcVar10 = cp + uVar11;
  s = cp + uVar12;
  cVar6 = '[';
  size = 0xffffffffffffffff;
  pcVar8 = s;
  pcVar5 = (char *)0x0;
  do {
    pcVar4 = pcVar8;
    if (cVar6 != '/') {
      if (cVar6 == '\0') {
        return -2;
      }
      pcVar4 = pcVar5;
      if (cVar6 == ']') {
        if (pcVar5 == (char *)0x0) {
          pcVar4 = pcp_strndup(s,size);
          *int_prefix = 0x80;
        }
        else {
          pcVar4 = pcp_strndup(s,(size_t)(pcVar5 + ~uVar12 + lVar7));
          pcVar5 = pcp_strndup(pcVar5,(long)pcVar10 - (long)pcVar5);
          if (pcVar5 != (char *)0x0) {
            iVar2 = atoi(pcVar5);
            *int_prefix = iVar2;
            free(pcVar5);
          }
        }
        pcVar8 = pcVar8 + -1;
        pcVar5 = (char *)0x0;
        do {
          pcVar10 = pcVar8 + (lVar7 - uVar12);
          pcVar9 = pcVar8;
LAB_0010657e:
          while( true ) {
            pcVar10 = pcVar10 + 1;
            pcVar8 = pcVar9 + 1;
            cVar6 = *pcVar8;
            if (cVar6 == ':') break;
            pcVar9 = pcVar8;
            if (cVar6 == '\0') goto LAB_001065b7;
          }
          if (pcVar5 != (char *)0x0) goto code_r0x00106594;
          pcVar5 = pcVar9 + 2;
        } while( true );
      }
    }
    cVar6 = *pcVar8;
    pcVar8 = pcVar8 + 1;
    size = size + 1;
    pcVar10 = pcVar10 + 1;
    pcVar5 = pcVar4;
  } while( true );
code_r0x00106594:
  pcVar9 = pcVar8;
  if (pcVar4 != (char *)0x0) goto LAB_0010657e;
  pcVar4 = strdup(s);
  pcVar5 = (char *)0x0;
LAB_001065b7:
  if (pcVar4 == (char *)0x0) {
    if (pcVar5 != (char *)0x0 && cVar6 == '\0') {
      if ((long)(pcVar5 + (lVar7 - uVar12)) < 2) {
        pcVar4 = (char *)0x0;
        goto LAB_001065f5;
      }
      pcVar10 = pcVar5 + ~uVar12 + lVar7;
    }
    pcVar4 = pcp_strndup(s,(size_t)pcVar10);
  }
LAB_001065f5:
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_socktype = 2;
  local_68.ai_protocol = 0;
  local_68.ai_flags = 8;
  local_68.ai_family = 0;
  __pai = (addrinfo **)&servinfo;
  iVar2 = getaddrinfo(pcVar4,pcVar5,&local_68,__pai);
  __stream = _stderr;
  if (iVar2 != 0) {
    pcVar8 = gai_strerror(iVar2);
    fprintf(__stream,"getaddrinfo: %s\n",pcVar8);
    free(pcVar4);
    return -2;
  }
LAB_0010663d:
  paVar1 = *__pai;
  if (paVar1 == (addrinfo *)0x0) {
LAB_00106688:
    freeaddrinfo((addrinfo *)servinfo);
    free(pcVar4);
    if (sa->sa_family == 10) {
      if (0x80 < *int_prefix) {
        return -2;
      }
    }
    else if ((sa->sa_family == 2) && (0x20 < *int_prefix)) {
      return -2;
    }
    return 0;
  }
  if ((paVar1->ai_family | 8U) == 10) {
    __n = 0x10;
    if (paVar1->ai_addr->sa_family == 10) {
      __n = 0x1c;
    }
    memcpy(sa,paVar1->ai_addr,__n);
    if (pcVar4 == (char *)0x0) {
      if (paVar1->ai_family != 10) {
        return -2;
      }
      sa[1].sa_data[2] = '\0';
      sa[1].sa_data[3] = '\0';
      sa[1].sa_data[4] = '\0';
      sa[1].sa_data[5] = '\0';
      sa[1].sa_data[6] = '\0';
      sa[1].sa_data[7] = '\0';
      sa[1].sa_data[8] = '\0';
      sa[1].sa_data[9] = '\0';
      *(undefined8 *)(sa[1].sa_data + 10) = 0;
      sa->sa_data[6] = '\0';
      sa->sa_data[7] = '\0';
      sa->sa_data[8] = '\0';
      sa->sa_data[9] = '\0';
      sa->sa_data[10] = '\0';
      sa->sa_data[0xb] = '\0';
      sa->sa_data[0xc] = '\0';
      sa->sa_data[0xd] = '\0';
      sa[1].sa_family = 0;
      sa[1].sa_data[0] = '\0';
      sa[1].sa_data[1] = '\0';
      sa[1].sa_data[2] = '\0';
      sa[1].sa_data[3] = '\0';
      sa[1].sa_data[4] = '\0';
      sa[1].sa_data[5] = '\0';
    }
    goto LAB_00106688;
  }
  __pai = &paVar1->ai_next;
  goto LAB_0010663d;
}

Assistant:

int sock_pton_with_prefix(const char *cp, struct sockaddr *sa,
                          int *int_prefix) {
    const char *prefix_begin = NULL;
    char *prefix = NULL;

    const char *ip_end;
    char *host_name = NULL;
    const char *port = NULL;

    if ((!cp) || (!sa) || (!int_prefix)) {
        return -1;
    }

    // skip ws
    while ((cp) && (isspace(*cp))) {
        ++cp;
    }

    ip_end = cp;
    if (*cp == '[') { // find matching bracket ']'
        ++cp;
        while ((*ip_end) && (*ip_end != ']')) {
            if (*ip_end == '/') {
                prefix_begin = ip_end + 1;
            }
            ++ip_end;
        }

        if (!*ip_end) {
            return -2;
        }

        if (prefix_begin) {
            host_name = strndup(cp, prefix_begin - cp - 1);
            prefix = strndup(prefix_begin, ip_end - prefix_begin);
            if (prefix) {
                *int_prefix = atoi(prefix);
                free(prefix);
            }
        } else {
            host_name = strndup(cp, ip_end - cp);
            *int_prefix = 128;
        }
        ++ip_end;
    } else {
        return -2;
    }

    { // find start of port part
        while (*ip_end) {
            if (*ip_end == ':') {
                if (!port) {
                    port = ip_end + 1;
                } else if (host_name == NULL) { // means addr has [] block
                    port = NULL; // more than 1 ":" => assume the whole addr is
                                 // IPv6 address w/o port
                    host_name = strdup(cp);
                    break;
                }
            }
            ++ip_end;
        }
        if (!host_name) {
            if ((*ip_end == 0) && (port != NULL)) {
                if (port - cp > 1) { // only port entered
                    host_name = strndup(cp, port - cp - 1);
                }
            } else {
                host_name = strndup(cp, ip_end - cp);
            }
        }
    }

    // getaddrinfo for host
    {
        struct addrinfo hints, *servinfo, *p;
        int rv;

        memset(&hints, 0, sizeof hints);
        hints.ai_family = AF_UNSPEC;
        hints.ai_socktype = SOCK_DGRAM;
        hints.ai_flags = AI_V4MAPPED;

        if ((rv = getaddrinfo(host_name, port, &hints, &servinfo)) != 0) {
            fprintf(stderr, "getaddrinfo: %s\n", gai_strerror(rv));
            if (host_name)
                free(host_name);
            return -2;
        }

        for (p = servinfo; p != NULL; p = p->ai_next) {
            if ((p->ai_family == AF_INET) || (p->ai_family == AF_INET6)) {
                memcpy(sa, p->ai_addr, SA_LEN(p->ai_addr));
                if (host_name == NULL) { // getaddrinfo returns localhost ip if
                                         // hostname is null
                    switch (p->ai_family) {
                    case AF_INET6:
                        memset(&((struct sockaddr_in6 *)sa)->sin6_addr, 0,
                               sizeof(struct sockaddr_in6));
                        break;
                    default: // Should never happen LCOV_EXCL_START
                        if (host_name)
                            free(host_name);
                        return -2;
                    } // LCOV_EXCL_STOP
                }
                break;
            }
        }
        freeaddrinfo(servinfo);
    }

    if (host_name)
        free(host_name);

    if ((sa->sa_family == AF_INET) && (*int_prefix > 32)) {

        return -2;
    }

    if ((sa->sa_family == AF_INET6) && (*int_prefix > 128)) {

        return -2;
    }

    return 0;
}